

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractStringValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractStringValidator::inspectFacetBase
          (AbstractStringValidator *this,MemoryManager *manager)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  AbstractStringValidator *this_00;
  XMLSize_t XVar4;
  XMLSize_t toFormat;
  XMLSize_t toFormat_00;
  XMLSize_t toFormat_01;
  XMLSize_t toFormat_02;
  XMLSize_t toFormat_03;
  InvalidDatatypeFacetException *pIVar5;
  RefArrayVectorOf<char16_t> *pRVar6;
  BaseRefVectorOf<char16_t> *pBVar7;
  char16_t *pcVar8;
  XMLSize_t enumLength;
  XMLSize_t i;
  XMLCh value2_10 [65];
  XMLCh local_c28 [4];
  XMLCh value1_10 [65];
  XMLCh local_b98 [4];
  XMLCh value2_9 [65];
  XMLCh local_b08 [4];
  XMLCh value1_9 [65];
  XMLCh local_a78 [4];
  XMLCh value2_8 [65];
  XMLCh local_9e8 [4];
  XMLCh value1_8 [65];
  XMLCh local_958 [4];
  XMLCh value2_7 [65];
  XMLCh local_8c8 [4];
  XMLCh value1_7 [65];
  XMLCh local_838 [4];
  XMLCh value2_6 [65];
  XMLCh local_7a8 [4];
  XMLCh value1_6 [65];
  XMLCh local_718 [4];
  XMLCh value2_5 [65];
  XMLCh local_688 [4];
  XMLCh value1_5 [65];
  XMLCh local_5f8 [4];
  XMLCh value2_4 [65];
  XMLCh local_568 [4];
  XMLCh value1_4 [65];
  XMLCh local_4d8 [4];
  XMLCh value2_3 [65];
  XMLCh local_448 [4];
  XMLCh value1_3 [65];
  XMLCh local_3b8 [4];
  XMLCh value2_2 [65];
  XMLCh local_328 [4];
  XMLCh value1_2 [65];
  XMLCh local_298 [4];
  XMLCh value2_1 [65];
  XMLCh local_208 [4];
  XMLCh value1_1 [65];
  XMLCh local_178 [4];
  XMLCh value2 [65];
  XMLCh local_e8 [4];
  XMLCh value1 [65];
  int baseFixed;
  XMLSize_t baseMaxLength;
  XMLSize_t baseMinLength;
  XMLSize_t baseLength;
  XMLSize_t thisMaxLength;
  XMLSize_t thisMinLength;
  XMLSize_t thisLength;
  int baseFacetsDefined;
  int thisFacetsDefined;
  AbstractStringValidator *pBaseValidator;
  MemoryManager *manager_local;
  AbstractStringValidator *this_local;
  
  this_00 = (AbstractStringValidator *)
            DatatypeValidator::getBaseValidator(&this->super_DatatypeValidator);
  uVar1 = DatatypeValidator::getFacetsDefined(&this->super_DatatypeValidator);
  if (((uVar1 != 0) || (this->fEnumeration != (RefArrayVectorOf<char16_t> *)0x0)) &&
     (this_00 != (AbstractStringValidator *)0x0)) {
    uVar2 = DatatypeValidator::getFacetsDefined((DatatypeValidator *)this_00);
    XVar4 = getLength(this);
    toFormat = getMinLength(this);
    toFormat_00 = getMaxLength(this);
    toFormat_01 = getLength(this_00);
    toFormat_02 = getMinLength(this_00);
    toFormat_03 = getMaxLength(this_00);
    uVar3 = DatatypeValidator::getFixed((DatatypeValidator *)this_00);
    if ((uVar1 & 1) != 0) {
      if (((uVar2 & 4) != 0) && (toFormat_03 < XVar4)) {
        XMLString::sizeToText(XVar4,local_e8,0x40,10,manager);
        XMLString::sizeToText(toFormat_03,local_178,0x40,10,manager);
        pIVar5 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                   ,0x13c,FACET_Len_baseMaxLen,local_e8,local_178,(XMLCh *)0x0,(XMLCh *)0x0,manager)
        ;
        __cxa_throw(pIVar5,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if (((uVar2 & 2) != 0) && (XVar4 < toFormat_02)) {
        XMLString::sizeToText(XVar4,local_208,0x40,10,manager);
        XMLString::sizeToText(toFormat_02,local_298,0x40,10,manager);
        pIVar5 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                   ,0x145,FACET_Len_baseMinLen,local_208,local_298,(XMLCh *)0x0,(XMLCh *)0x0,manager
                  );
        __cxa_throw(pIVar5,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    if ((uVar2 & 1) != 0) {
      if (((uVar1 & 4) != 0) && (toFormat_00 < toFormat_01)) {
        XMLString::sizeToText(toFormat_00,local_328,0x40,10,manager);
        XMLString::sizeToText(toFormat_01,local_3b8,0x40,10,manager);
        pIVar5 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                   ,0x153,FACET_maxLen_baseLen,local_328,local_3b8,(XMLCh *)0x0,(XMLCh *)0x0,manager
                  );
        __cxa_throw(pIVar5,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if (((uVar1 & 2) != 0) && (toFormat_01 < toFormat)) {
        XMLString::sizeToText(toFormat,local_448,0x40,10,manager);
        XMLString::sizeToText(toFormat_01,local_4d8,0x40,10,manager);
        pIVar5 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                   ,0x15c,FACET_minLen_baseLen,local_448,local_4d8,(XMLCh *)0x0,(XMLCh *)0x0,manager
                  );
        __cxa_throw(pIVar5,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    if ((((uVar1 & 1) != 0) && ((uVar2 & 1) != 0)) && (XVar4 != toFormat_01)) {
      XMLString::sizeToText(XVar4,local_568,0x40,10,manager);
      XMLString::sizeToText(toFormat_01,local_5f8,0x40,10,manager);
      pIVar5 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                 ,0x169,FACET_Len_baseLen,local_568,local_5f8,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      __cxa_throw(pIVar5,&InvalidDatatypeFacetException::typeinfo,
                  InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
    }
    if ((((uVar1 & 2) != 0) && ((uVar2 & 4) != 0)) && (toFormat_03 < toFormat)) {
      XMLString::sizeToText(toFormat,local_688,0x40,10,manager);
      XMLString::sizeToText(toFormat_03,local_718,0x40,10,manager);
      pIVar5 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                 ,0x17c,FACET_minLen_basemaxLen,local_688,local_718,(XMLCh *)0x0,(XMLCh *)0x0,
                 manager);
      __cxa_throw(pIVar5,&InvalidDatatypeFacetException::typeinfo,
                  InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
    }
    if (((uVar1 & 2) != 0) && ((uVar2 & 2) != 0)) {
      if ((uVar3 & 2) == 0) {
        if (toFormat < toFormat_02) {
          XMLString::sizeToText(toFormat,local_8c8,0x40,10,manager);
          XMLString::sizeToText(toFormat_02,local_958,0x40,10,manager);
          pIVar5 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (pIVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                     ,0x196,FACET_minLen_baseminLen,local_8c8,local_958,(XMLCh *)0x0,(XMLCh *)0x0,
                     manager);
          __cxa_throw(pIVar5,&InvalidDatatypeFacetException::typeinfo,
                      InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
        }
      }
      else if (toFormat != toFormat_02) {
        XMLString::sizeToText(toFormat,local_7a8,0x40,10,manager);
        XMLString::sizeToText(toFormat_02,local_838,0x40,10,manager);
        pIVar5 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                   ,0x18b,FACET_minLen_base_fixed,local_7a8,local_838,(XMLCh *)0x0,(XMLCh *)0x0,
                   manager);
        __cxa_throw(pIVar5,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    if ((((uVar2 & 2) != 0) && ((uVar1 & 4) != 0)) && (toFormat_00 < toFormat_02)) {
      XMLString::sizeToText(toFormat_00,local_9e8,0x40,10,manager);
      XMLString::sizeToText(toFormat_02,local_a78,0x40,10,manager);
      pIVar5 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                 ,0x1a4,FACET_maxLen_baseminLen,local_9e8,local_a78,(XMLCh *)0x0,(XMLCh *)0x0,
                 manager);
      __cxa_throw(pIVar5,&InvalidDatatypeFacetException::typeinfo,
                  InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
    }
    if (((uVar1 & 4) != 0) && ((uVar2 & 4) != 0)) {
      if ((uVar3 & 4) == 0) {
        if (toFormat_03 < toFormat_00) {
          XMLString::sizeToText(toFormat_00,local_c28,0x40,10,manager);
          XMLString::sizeToText(toFormat_03,(XMLCh *)&i,0x40,10,manager);
          pIVar5 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (pIVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                     ,0x1bd,FACET_maxLen_basemaxLen,local_c28,(XMLCh *)&i,(XMLCh *)0x0,(XMLCh *)0x0,
                     manager);
          __cxa_throw(pIVar5,&InvalidDatatypeFacetException::typeinfo,
                      InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
        }
      }
      else if (toFormat_00 != toFormat_03) {
        XMLString::sizeToText(toFormat_00,local_b08,0x40,10,manager);
        XMLString::sizeToText(toFormat_03,local_b98,0x40,10,manager);
        pIVar5 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                   ,0x1b3,FACET_maxLen_base_fixed,local_b08,local_b98,(XMLCh *)0x0,(XMLCh *)0x0,
                   manager);
        __cxa_throw(pIVar5,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    if (((uVar1 & 0x10) != 0) &&
       (pRVar6 = getEnumeration(this), pRVar6 != (RefArrayVectorOf<char16_t> *)0x0)) {
      enumLength = 0;
      pBVar7 = &getEnumeration(this)->super_BaseRefVectorOf<char16_t>;
      XVar4 = BaseRefVectorOf<char16_t>::size(pBVar7);
      for (; enumLength < XVar4; enumLength = enumLength + 1) {
        pBVar7 = &getEnumeration(this)->super_BaseRefVectorOf<char16_t>;
        pcVar8 = BaseRefVectorOf<char16_t>::elementAt(pBVar7,enumLength);
        (*(this_00->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x14])
                  (this_00,pcVar8,0,0,manager);
      }
    }
    (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0xe])(this,manager);
  }
  return;
}

Assistant:

void AbstractStringValidator::inspectFacetBase(MemoryManager* const manager)
{

    AbstractStringValidator *pBaseValidator = (AbstractStringValidator*) getBaseValidator();
    int thisFacetsDefined = getFacetsDefined();

    if ( (!thisFacetsDefined && !fEnumeration) ||
         (!pBaseValidator)                      )
        return;

    int baseFacetsDefined = pBaseValidator->getFacetsDefined();

    XMLSize_t thisLength    = getLength();
    XMLSize_t thisMinLength = getMinLength();
    XMLSize_t thisMaxLength = getMaxLength();

    XMLSize_t baseLength    = pBaseValidator->getLength();
    XMLSize_t baseMinLength = pBaseValidator->getMinLength();
    XMLSize_t baseMaxLength = pBaseValidator->getMaxLength();
    int baseFixed     = pBaseValidator->getFixed();

    /***
       check facets against base.facets
       Note: later we need to check the "fix" option of the base type
            and apply that to every individual facet.
    ***/

    /***
                Non coexistence of derived' length and base'    (minLength | maxLength)
                                   base'    length and derived' (minLength | maxLength)

     E2-35
     It is an error for both length and either of minLength or maxLength to be members of {facets},
     unless they are specified in different derivation steps in which case the following must be true:
     the {value} of minLength <= the {value} of length <= the {value} of maxLength
    ***/

    // error: length > base.maxLength
    //        length < base.minLength
    if ((thisFacetsDefined & DatatypeValidator::FACET_LENGTH) !=0)
    {
        if (((baseFacetsDefined & DatatypeValidator::FACET_MAXLENGTH) !=0) &&
             (thisLength > baseMaxLength)                                   )
        {
            REPORT_FACET_ERROR(thisLength
                             , baseMaxLength
                             , XMLExcepts::FACET_Len_baseMaxLen
                             , manager)
        }

        if (((baseFacetsDefined & DatatypeValidator::FACET_MINLENGTH) !=0) &&
             (thisLength < baseMinLength)                                   )
        {
            REPORT_FACET_ERROR(thisLength
                             , baseMinLength
                             , XMLExcepts::FACET_Len_baseMinLen
                             , manager)
        }
    }

    // error: baseLength > maxLength
    //        baseLength < minLength
    if ((baseFacetsDefined & DatatypeValidator::FACET_LENGTH) !=0)
    {
        if (((thisFacetsDefined & DatatypeValidator::FACET_MAXLENGTH) !=0) &&
             (baseLength > thisMaxLength)                                   )
        {
            REPORT_FACET_ERROR(thisMaxLength
                             , baseLength
                             , XMLExcepts::FACET_maxLen_baseLen
                             , manager)
        }

        if (((thisFacetsDefined & DatatypeValidator::FACET_MINLENGTH) !=0) &&
             (baseLength < thisMinLength)                                   )
        {
            REPORT_FACET_ERROR(thisMinLength
                             , baseLength
                             , XMLExcepts::FACET_minLen_baseLen
                             , manager)
        }
    }

    // check 4.3.1.c2 error: length != base.length
    if (((thisFacetsDefined & DatatypeValidator::FACET_LENGTH) !=0) &&
        ((baseFacetsDefined & DatatypeValidator::FACET_LENGTH) !=0))
    {
        if ( thisLength != baseLength )
        {
            REPORT_FACET_ERROR(thisLength
                             , baseLength
                             , XMLExcepts::FACET_Len_baseLen
                             , manager)
        }
    }

    /***
                                   |---  derived   ---|
                base.minLength <= minLength <= maxLength <= base.maxLength
                |-------------------        base      -------------------|
    ***/

    // check 4.3.2.c1 must: minLength <= base.maxLength
    if (((thisFacetsDefined & DatatypeValidator::FACET_MINLENGTH ) != 0) &&
        ((baseFacetsDefined & DatatypeValidator::FACET_MAXLENGTH ) != 0))
    {
        if ( thisMinLength > baseMaxLength )
        {
            REPORT_FACET_ERROR(thisMinLength
                             , baseMaxLength
                             , XMLExcepts::FACET_minLen_basemaxLen
                             , manager)
        }
    }

    // check 4.3.2.c2 error: minLength < base.minLength
    if (((thisFacetsDefined & DatatypeValidator::FACET_MINLENGTH) !=0) &&
        ((baseFacetsDefined & DatatypeValidator::FACET_MINLENGTH) != 0))
    {
        if ((baseFixed & DatatypeValidator::FACET_MINLENGTH) !=0)
        {
            if ( thisMinLength != baseMinLength )
            {
                REPORT_FACET_ERROR(thisMinLength
                                 , baseMinLength
                                 , XMLExcepts::FACET_minLen_base_fixed
                                 , manager)
            }

        }
        else
        {
            if ( thisMinLength < baseMinLength )
            {
                REPORT_FACET_ERROR(thisMinLength
                                 , baseMinLength
                                 , XMLExcepts::FACET_minLen_baseminLen
                                 , manager)
            }
        }
    }

    // check 4.3.2.c1 must: base.minLength <= maxLength
    if (((baseFacetsDefined & DatatypeValidator::FACET_MINLENGTH) !=0) &&
        ((thisFacetsDefined & DatatypeValidator::FACET_MAXLENGTH) !=0))
    {
        if ( baseMinLength > thisMaxLength )
        {
            REPORT_FACET_ERROR(thisMaxLength
                             , baseMinLength
                             , XMLExcepts::FACET_maxLen_baseminLen
                             , manager)
        }
    }

    // check 4.3.3.c1 error: maxLength > base.maxLength
    if (((thisFacetsDefined & DatatypeValidator::FACET_MAXLENGTH) !=0) &&
        ((baseFacetsDefined & DatatypeValidator::FACET_MAXLENGTH) !=0))
    {
        if ((baseFixed & DatatypeValidator::FACET_MAXLENGTH) !=0)
        {
            if ( thisMaxLength != baseMaxLength )
            {
                REPORT_FACET_ERROR(thisMaxLength
                                 , baseMaxLength
                                 , XMLExcepts::FACET_maxLen_base_fixed
                                 , manager)
            }
        }
        else
        {
            if ( thisMaxLength > baseMaxLength )
            {
                REPORT_FACET_ERROR(thisMaxLength
                                 , baseMaxLength
                                 , XMLExcepts::FACET_maxLen_basemaxLen
                                 , manager)
            }
        }
    }

    // check 4.3.5.c0 must: enumeration values from the value space of base
    if ( ((thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0) &&
        (getEnumeration() !=0))
    {
        XMLSize_t i = 0;
        XMLSize_t enumLength = getEnumeration()->size();
        for ( ; i < enumLength; i++)
        {
            // ask parent do a complete check
            pBaseValidator->checkContent(getEnumeration()->elementAt(i), (ValidationContext*)0, false, manager);
#if 0
// spec says that only base has to checkContent
            // enum shall pass this->checkContent() as well.
            checkContent(getEnumeration()->elementAt(i), (ValidationContext*)0, false, manager);
#endif
        }
    }

    checkAdditionalFacetConstraints(manager);

}